

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O1

libcaption_stauts_t caption_frame_decode(caption_frame_t *frame,uint16_t cc_data,double timestamp)

{
  double dVar1;
  libcaption_stauts_t lVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)cc_data;
  if (CONCAT11(eia608_parity_table[(byte)(cc_data >> 8) & 0x7f],eia608_parity_table[uVar4 & 0x7f])
      != cc_data) {
    frame->status = LIBCAPTION_ERROR;
    return LIBCAPTION_ERROR;
  }
  if (cc_data == 0x8080) goto LAB_00105478;
  dVar1 = frame->timestamp;
  if (dVar1 < 0.0) {
LAB_0010542c:
    frame->timestamp = timestamp;
    frame->status = LIBCAPTION_OK;
  }
  else if (((dVar1 == timestamp) && (!NAN(dVar1) && !NAN(timestamp))) ||
          (frame->status == LIBCAPTION_READY)) goto LAB_0010542c;
  uVar3 = uVar4 & 0x7770;
  if (((uVar3 == 0x1130) || ((cc_data & 0x7670) == 0x1420 || (cc_data & 0x7770) == 0x1720)) &&
     ((frame->state).cc_data == cc_data)) {
LAB_00105478:
    frame->status = LIBCAPTION_OK;
    return LIBCAPTION_OK;
  }
  (frame->state).cc_data = cc_data;
  if (((frame->xds).state == 0) && ((cc_data & 0xf0f) == 0 || (cc_data & 0x7070) != 0)) {
    if ((cc_data & 0x7670) != 0x1420 && (cc_data & 0x7770) != 0x1720) {
      if (((uVar4 & 0x1660) == 0x1220 || uVar3 == 0x1130) || (cc_data & 0x6000) != 0) {
        if (frame->write == (caption_frame_buffer_t *)0x0) goto LAB_00105478;
        caption_frame_decode_text(frame,cc_data);
        frame->status = (frame->write == &frame->front) + LIBCAPTION_OK;
      }
      else {
        if ((~uVar4 & 0x1040) == 0) {
          caption_frame_decode_preamble(frame,cc_data);
        }
        else {
          if (uVar3 != 0x1120) goto LAB_00105560;
          caption_frame_decode_midrowchange(frame,cc_data);
        }
        frame->status = LIBCAPTION_OK;
      }
      goto LAB_00105560;
    }
    lVar2 = caption_frame_decode_control(frame,cc_data);
  }
  else {
    lVar2 = xds_decode(&frame->xds,cc_data);
  }
  frame->status = lVar2;
LAB_00105560:
  return frame->status;
}

Assistant:

libcaption_stauts_t caption_frame_decode(caption_frame_t* frame, uint16_t cc_data, double timestamp)
{
    if (!eia608_parity_varify(cc_data)) {
        frame->status = LIBCAPTION_ERROR;
        return frame->status;
    }

    if (eia608_is_padding(cc_data)) {
        frame->status = LIBCAPTION_OK;
        return frame->status;
    }

    if (0 > frame->timestamp || frame->timestamp == timestamp || LIBCAPTION_READY == frame->status) {
        frame->timestamp = timestamp;
        frame->status = LIBCAPTION_OK;
    }

    // skip duplicate controll commands. We also skip duplicate specialna to match the behaviour of iOS/vlc
    if ((eia608_is_specialna(cc_data) || eia608_is_control(cc_data)) && cc_data == frame->state.cc_data) {
        frame->status = LIBCAPTION_OK;
        return frame->status;
    }

    frame->state.cc_data = cc_data;

    if (frame->xds.state) {
        frame->status = xds_decode(&frame->xds, cc_data);
    } else if (eia608_is_xds(cc_data)) {
        frame->status = xds_decode(&frame->xds, cc_data);
    } else if (eia608_is_control(cc_data)) {
        frame->status = caption_frame_decode_control(frame, cc_data);
    } else if (eia608_is_basicna(cc_data) || eia608_is_specialna(cc_data) || eia608_is_westeu(cc_data)) {

        // Don't decode text if we dont know what mode we are in.
        if (!frame->write) {
            frame->status = LIBCAPTION_OK;
            return frame->status;
        }

        frame->status = caption_frame_decode_text(frame, cc_data);

        // If we are in paint on mode, display immiditally
        if (LIBCAPTION_OK == frame->status && caption_frame_painton(frame)) {
            frame->status = LIBCAPTION_READY;
        }
    } else if (eia608_is_preamble(cc_data)) {
        frame->status = caption_frame_decode_preamble(frame, cc_data);
    } else if (eia608_is_midrowchange(cc_data)) {
        frame->status = caption_frame_decode_midrowchange(frame, cc_data);
    }

    return frame->status;
}